

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_common.c
# Opt level: O1

void av1_cdef_frame_mt(AV1_COMMON *cm,MACROBLOCKD *xd,AV1CdefWorkerData *cdef_worker,
                      AVxWorker *workers,AV1CdefSync *cdef_sync,int num_workers,
                      cdef_init_fb_row_t cdef_init_fb_row_fn,int do_extend_border)

{
  ulong uVar1;
  uint8_t uVar2;
  int iVar3;
  AVxWorkerInterface *pAVar4;
  uint16_t **ppuVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  AVxWorker *pAVar9;
  int iVar10;
  long lVar11;
  AVxWorker *worker;
  AVxWorker *pAVar12;
  bool bVar13;
  aom_internal_error_info error_info;
  aom_internal_error_info local_1d0;
  
  bVar13 = cm->seq_params->monochrome == '\0';
  lVar6 = 0;
  av1_setup_dst_planes
            (xd->plane,cm->seq_params->sb_size,&cm->cur_frame->buf,0,0,0,bVar13 + 1 + (uint)bVar13);
  *(undefined8 *)((long)&cdef_sync->fbr + 1) = 0;
  cdef_sync->end_of_frame = 0;
  cdef_sync->fbr = 0;
  uVar2 = cm->seq_params->monochrome;
  cdef_worker->srcbuf = (cm->cdef_info).srcbuf;
  lVar11 = (ulong)(uVar2 == '\0') * 2 + 1;
  do {
    cdef_worker->colbuf[lVar6] = (cm->cdef_info).colbuf[lVar6];
    lVar6 = lVar6 + 1;
  } while (lVar11 != lVar6);
  uVar7 = (ulong)(uint)num_workers;
  if (0 < num_workers) {
    ppuVar5 = cdef_worker[uVar7 - 1].linebuf;
    uVar8 = uVar7;
    do {
      uVar1 = uVar8 - 1;
      cdef_worker[uVar1].cm = cm;
      cdef_worker[uVar1].xd = xd;
      cdef_worker[uVar1].cdef_init_fb_row_fn = cdef_init_fb_row_fn;
      cdef_worker[uVar1].do_extend_border = do_extend_border;
      lVar6 = 0;
      do {
        ppuVar5[lVar6] = (cm->cdef_info).linebuf[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar11 != lVar6);
      workers[uVar1].hook = cdef_sb_row_worker_hook;
      workers[uVar1].data1 = cdef_sync;
      workers[uVar1].data2 = cdef_worker + uVar1;
      ppuVar5 = ppuVar5 + -0x3f;
      bVar13 = 1 < (long)uVar8;
      uVar8 = uVar1;
    } while (bVar13);
  }
  pAVar4 = aom_get_worker_interface();
  if (0 < num_workers) {
    lVar11 = uVar7 + 1;
    pAVar12 = workers + uVar7;
    do {
      pAVar9 = pAVar12 + -1;
      pAVar12[-1].had_error = 0;
      if (lVar11 == 2) {
        (*pAVar4->execute)(pAVar9);
      }
      else {
        (*pAVar4->launch)(pAVar9);
      }
      lVar11 = lVar11 + -1;
      pAVar12 = pAVar9;
    } while (1 < lVar11);
  }
  pAVar4 = aom_get_worker_interface();
  iVar10 = workers->had_error;
  if (iVar10 != 0) {
    memcpy(&local_1d0,(void *)((long)workers->data2 + 0x58),0x1a0);
  }
  if (1 < num_workers) {
    lVar11 = uVar7 + 1;
    pAVar12 = workers + uVar7;
    do {
      iVar3 = (*pAVar4->sync)(pAVar12 + -1);
      if (iVar3 == 0) {
        memcpy(&local_1d0,(void *)((long)pAVar12[-1].data2 + 0x58),0x1a0);
        iVar10 = 1;
      }
      lVar11 = lVar11 + -1;
      pAVar12 = pAVar12 + -1;
    } while (2 < lVar11);
  }
  if (iVar10 != 0) {
    aom_internal_error_copy(cm->error,&local_1d0);
  }
  return;
}

Assistant:

void av1_cdef_frame_mt(AV1_COMMON *const cm, MACROBLOCKD *const xd,
                       AV1CdefWorkerData *const cdef_worker,
                       AVxWorker *const workers, AV1CdefSync *const cdef_sync,
                       int num_workers, cdef_init_fb_row_t cdef_init_fb_row_fn,
                       int do_extend_border) {
  YV12_BUFFER_CONFIG *frame = &cm->cur_frame->buf;
  const int num_planes = av1_num_planes(cm);

  av1_setup_dst_planes(xd->plane, cm->seq_params->sb_size, frame, 0, 0, 0,
                       num_planes);

  reset_cdef_job_info(cdef_sync);
  prepare_cdef_frame_workers(cm, xd, cdef_worker, cdef_sb_row_worker_hook,
                             workers, cdef_sync, num_workers,
                             cdef_init_fb_row_fn, do_extend_border);
  launch_cdef_workers(workers, num_workers);
  sync_cdef_workers(workers, cm, num_workers);
}